

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O1

void hputs(char *hstring,char *keyword,char *cval)

{
  size_t sVar1;
  int iVar2;
  char value [70];
  char local_68;
  char local_67 [71];
  
  sVar1 = strlen(cval);
  iVar2 = 0x43;
  if ((int)sVar1 < 0x43) {
    iVar2 = (int)sVar1;
  }
  local_68 = '\'';
  strncpy(local_67,cval,(long)iVar2);
  (local_67 + iVar2)[0] = '\'';
  (local_67 + iVar2)[1] = '\0';
  hputc(hstring,keyword,&local_68);
  return;
}

Assistant:

static void
hputs (hstring,keyword,cval)

char *hstring;	/* FITS header */
char *keyword;	/* Keyword name */
char *cval;	/* character string containing the value for variable
		   keyword.  trailing and leading blanks are removed.  */
{
    char squot = 39;
    char value[70];
    int lcval;

    /*  find length of variable string */

    lcval = strlen (cval);
    if (lcval > 67)
	lcval = 67;

    /* Put quotes around string */
    value[0] = squot;
    strncpy (&value[1],cval,lcval);
    value[lcval+1] = squot;
    value[lcval+2] = 0;

    /* Put value into header string */
    hputc (hstring,keyword,value);

    /* Return to calling program */
    return;
}